

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vauth.c
# Opt level: O0

_Bool Curl_auth_user_contains_domain(char *user)

{
  char *pcVar1;
  size_t sVar2;
  _Bool local_21;
  char *p;
  _Bool valid;
  char *user_local;
  
  p._7_1_ = false;
  if ((user != (char *)0x0) && (*user != '\0')) {
    pcVar1 = strpbrk(user,"\\/@");
    local_21 = false;
    if ((pcVar1 != (char *)0x0) && (local_21 = false, user < pcVar1)) {
      sVar2 = strlen(user);
      local_21 = pcVar1 < user + (sVar2 - 1);
    }
    p._7_1_ = local_21;
  }
  return p._7_1_;
}

Assistant:

bool Curl_auth_user_contains_domain(const char *user)
{
  bool valid = FALSE;

  if(user && *user) {
    /* Check we have a domain name or UPN present */
    char *p = strpbrk(user, "\\/@");

    valid = (p != NULL && p > user && p < user + strlen(user) - 1);
  }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  else
    /* User and domain are obtained from the GSS-API credentials cache or the
       currently logged in user from Windows */
    valid = TRUE;
#endif

  return valid;
}